

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O2

void time_map_fetch<EasyUseMap<HashObject<4,4>,int>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  uint *puVar1;
  iterator iVar2;
  size_t in_RCX;
  size_t start_memory;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  double t_00;
  key_type local_80;
  int local_7c;
  Rusage t;
  EasyUseMap<HashObject<4,_4>,_int> set;
  
  set.
  super_map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &set.
        super_map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header;
  set.
  super_map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  set.
  super_map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  set.
  super_map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  set.
  super_map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       set.
       super_map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
       ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Rusage::Rusage(&t);
  uVar4 = 0;
  uVar3 = 0;
  if (0 < iters) {
    uVar3 = iters;
  }
  while (uVar3 != uVar4) {
    local_80.i_ = uVar4;
    puVar1 = (uint *)std::
                     map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                     ::operator[](&set.
                                   super_map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                                  ,&local_80);
    uVar4 = uVar4 + 1;
    *puVar1 = uVar4;
  }
  local_7c = iters;
  Rusage::Reset(&t);
  uVar4 = 1;
  for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    local_80.i_ = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar5];
    iVar2 = std::
            _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
            ::find((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                    *)&set,&local_80);
    bVar6 = (_Rb_tree_header *)iVar2._M_node !=
            &set.
             super_map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
             ._M_t._M_impl.super__Rb_tree_header;
    in_RCX = (size_t)bVar6;
    uVar4 = uVar4 ^ bVar6;
  }
  t_00 = Rusage::UserTime(&t);
  srand(uVar4);
  report(title,t_00,local_7c,start_memory,in_RCX);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)&set);
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}